

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validatePoolingLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  bool bVar1;
  PoolingLayerParams *pPVar2;
  allocator local_81;
  undefined1 local_80 [40];
  string err;
  string local_38;
  
  Result::Result(__return_storage_ptr__);
  validateInputCount((Result *)local_80,layer,1,1);
  Result::operator=(__return_storage_ptr__,(Result *)local_80);
  std::__cxx11::string::~string((string *)(local_80 + 8));
  bVar1 = Result::good(__return_storage_ptr__);
  if (bVar1) {
    validateOutputCount((Result *)local_80,layer,1,1);
    Result::operator=(__return_storage_ptr__,(Result *)local_80);
    std::__cxx11::string::~string((string *)(local_80 + 8));
    bVar1 = Result::good(__return_storage_ptr__);
    if (bVar1) {
      if (this->ndArrayInterpretation == true) {
        std::__cxx11::string::string((string *)&local_38,"Pooling",(allocator *)&err);
        validateInputOutputRankEquality((Result *)local_80,layer,&local_38,&this->blobNameToRank);
        Result::operator=(__return_storage_ptr__,(Result *)local_80);
        std::__cxx11::string::~string((string *)(local_80 + 8));
        std::__cxx11::string::~string((string *)&local_38);
        bVar1 = Result::good(__return_storage_ptr__);
        if (!bVar1) {
          return __return_storage_ptr__;
        }
        std::__cxx11::string::string((string *)&err,"Pooling",&local_81);
        validateRankCount((Result *)local_80,layer,&err,4,-1,&this->blobNameToRank);
        Result::operator=(__return_storage_ptr__,(Result *)local_80);
        std::__cxx11::string::~string((string *)(local_80 + 8));
        std::__cxx11::string::~string((string *)&err);
        bVar1 = Result::good(__return_storage_ptr__);
        if (!bVar1) {
          return __return_storage_ptr__;
        }
      }
      pPVar2 = Specification::NeuralNetworkLayer::pooling(layer);
      if (pPVar2->_oneof_case_[0] == 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80
                       ,"Padding type for the pooling layer \'",(layer->name_).ptr_);
        std::operator+(&err,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_80,"\' is not set.");
        std::__cxx11::string::~string((string *)local_80);
        Result::Result((Result *)local_80,INVALID_MODEL_PARAMETERS,&err);
        Result::operator=(__return_storage_ptr__,(Result *)local_80);
        std::__cxx11::string::~string((string *)(local_80 + 8));
        std::__cxx11::string::~string((string *)&err);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validatePoolingLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (!r.good()) {return r;}

    r = validateOutputCount(layer, 1, 1);
    if (!r.good()) {return r;}

    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "Pooling", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "Pooling", 4, -1, blobNameToRank);
        if (!r.good()) {return r;}
    }

    // We need to check if the PoolingPaddingType is set
    if (layer.pooling().PoolingPaddingType_case() == Specification::PoolingLayerParams::PoolingPaddingTypeCase::POOLINGPADDINGTYPE_NOT_SET) {
        std::string err = "Padding type for the pooling layer '" + layer.name() + "' is not set.";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    return r;
}